

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# staj_event.hpp
# Opt level: O2

void __thiscall
jsoncons::basic_staj_event<char>::send_value_event
          (basic_staj_event<char> *this,basic_item_event_visitor<char> *visitor,ser_context *context
          ,error_code *ec)

{
  anon_union_8_7_566b3ed5_for_value_ local_10;
  anon_union_8_7_566b3ed5_for_value_ aStack_8;
  
  switch(this->event_type_) {
  case key:
  case string_value:
    aStack_8 = this->value_;
    local_10 = (anon_union_8_7_566b3ed5_for_value_)this->length_;
    basic_item_event_visitor<char>::string_value
              (visitor,(string_view_type *)&local_10,this->tag_,context);
    break;
  case byte_string_value:
    local_10 = this->value_;
    aStack_8 = (anon_union_8_7_566b3ed5_for_value_)this->length_;
    basic_item_event_visitor<char>::byte_string_value<jsoncons::byte_string_view>
              (visitor,(byte_string_view *)&local_10,this->tag_,context,0);
    break;
  case null_value:
    basic_item_event_visitor<char>::null_value(visitor,this->tag_,context);
    return;
  case bool_value:
    basic_item_event_visitor<char>::bool_value
              (visitor,(this->value_).bool_value_,this->tag_,context);
    return;
  case int64_value:
    basic_item_event_visitor<char>::int64_value
              (visitor,(this->value_).int64_value_,this->tag_,context);
    return;
  case uint64_value:
    basic_item_event_visitor<char>::uint64_value
              (visitor,(this->value_).uint64_value_,this->tag_,context);
    return;
  case end_object:
    (*visitor->_vptr_basic_item_event_visitor[5])
              (visitor,context,ec,ec,visitor->_vptr_basic_item_event_visitor[5]);
    return;
  case half_value:
    basic_item_event_visitor<char>::half_value
              (visitor,(this->value_).half_value_,this->tag_,context);
    return;
  case double_value:
    basic_item_event_visitor<char>::double_value
              (visitor,(this->value_).double_value_,this->tag_,context);
    return;
  case begin_object:
    (*visitor->_vptr_basic_item_event_visitor[3])
              (visitor,(ulong)this->tag_,context,ec,visitor->_vptr_basic_item_event_visitor[3]);
    return;
  case begin_array:
    basic_item_event_visitor<char>::begin_array(visitor,this->tag_,context);
    return;
  case end_array:
    basic_item_event_visitor<char>::end_array(visitor,context);
    return;
  }
  return;
}

Assistant:

void send_value_event(basic_item_event_visitor<CharT>& visitor,
        const ser_context& context,
        std::error_code& ec) const
    {
        switch (event_type())
        {
            case staj_event_type::key:
                visitor.string_value(string_view_type(value_.string_data_,length_), tag(), context);
                break;
            case staj_event_type::begin_array:
                visitor.begin_array(tag(), context);
                break;
            case staj_event_type::end_array:
                visitor.end_array(context);
                break;
            case staj_event_type::begin_object:
                visitor.begin_object(tag(), context, ec);
                break;
            case staj_event_type::end_object:
                visitor.end_object(context, ec);
                break;
            case staj_event_type::string_value:
                visitor.string_value(string_view_type(value_.string_data_,length_), tag(), context);
                break;
            case staj_event_type::byte_string_value:
                visitor.byte_string_value(byte_string_view(value_.byte_string_data_,length_), tag(), context);
                break;
            case staj_event_type::null_value:
                visitor.null_value(tag(), context);
                break;
            case staj_event_type::bool_value:
                visitor.bool_value(value_.bool_value_, tag(), context);
                break;
            case staj_event_type::int64_value:
                visitor.int64_value(value_.int64_value_, tag(), context);
                break;
            case staj_event_type::uint64_value:
                visitor.uint64_value(value_.uint64_value_, tag(), context);
                break;
            case staj_event_type::half_value:
                visitor.half_value(value_.half_value_, tag(), context);
                break;
            case staj_event_type::double_value:
                visitor.double_value(value_.double_value_, tag(), context);
                break;
            default:
                break;
        }
    }